

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry>::setCapacity
          (Vector<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> *this,
          size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> *pAVar2;
  size_t __length;
  size_t extraout_RDX;
  size_t size;
  undefined1 local_38 [8];
  ArrayBuilder<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> newBuilder;
  size_t newSize_local;
  Vector<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)
           ArrayBuilder<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry>::size
                     (&this->builder);
  size = __length;
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry>::truncate
              (&this->builder,(char *)newBuilder.disposer,__length);
    size = extraout_RDX;
  }
  heapArrayBuilder<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Entry>
            ((ArrayBuilder<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> *)
             local_38,(kj *)newBuilder.disposer,size);
  pAVar2 = mv<kj::ArrayBuilder<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Entry>>
                     (&this->builder);
  ArrayBuilder<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Entry>::
  addAll<kj::ArrayBuilder<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Entry>>
            ((ArrayBuilder<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Entry> *)
             local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Entry>>
                     ((ArrayBuilder<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry>
                       *)local_38);
  ArrayBuilder<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry>::operator=
            (&this->builder,pAVar2);
  ArrayBuilder<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry>::~ArrayBuilder
            ((ArrayBuilder<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> *)
             local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }